

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
Parser::parseMacroCall(Parser *this)

{
  pointer pCVar1;
  iterator iVar2;
  bool bVar3;
  Identifier *pIVar4;
  pointer ppVar5;
  ParserMacro *fmt;
  pointer pCVar6;
  Token *pTVar7;
  vector<Token,_std::allocator<Token>_> *pvVar8;
  size_type sVar9;
  reference pvVar10;
  reference identifier;
  set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> *this_00;
  string *psVar11;
  Parser *in_RSI;
  unsigned_long *in_R9;
  pair<std::_Rb_tree_const_iterator<Identifier>,_bool> pVar12;
  path local_310;
  string local_2f0;
  Identifier local_2d0;
  string local_2b0;
  Identifier local_290;
  Identifier local_270;
  string local_250;
  Identifier local_230;
  undefined1 local_210 [8];
  string fullName;
  _Self local_1e8;
  reference local_1e0;
  Identifier *label;
  iterator __end1;
  iterator __begin1;
  set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> *__range1;
  undefined1 local_1a0 [8];
  unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> command;
  size_type local_188;
  size_type local_160;
  size_t count;
  undefined1 local_150;
  undefined1 local_148 [8];
  optional<std::vector<Token,_std::allocator<Token>_>_> tokens;
  size_type local_120 [3];
  pointer local_108;
  size_t i;
  set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> identifierParameters;
  TokenStreamTokenizer macroTokenizer;
  ParserMacro *macro;
  _Self local_28;
  iterator it;
  Token *start;
  Parser *this_local;
  
  it._M_node = (_Base_ptr)peekToken(in_RSI,0);
  if (((Token *)it._M_node)->type == Identifier) {
    pIVar4 = Token::identifierValue((Token *)it._M_node);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
         ::find(&in_RSI->macros,pIVar4);
    macro = (ParserMacro *)
            std::
            map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
            ::end(&in_RSI->macros);
    bVar3 = std::operator==(&local_28,(_Self *)&macro);
    if (bVar3) {
      std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
      unique_ptr<std::default_delete<CAssemblerCommand>,void>
                ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                 (nullptr_t)0x0);
    }
    else {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_Identifier,_ParserMacro>_>::operator->
                         (&local_28);
      fmt = &ppVar5->second;
      eatToken(in_RSI);
      TokenStreamTokenizer::TokenStreamTokenizer
                ((TokenStreamTokenizer *)
                 &identifierParameters._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::set
                ((set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> *)&i);
      for (local_108 = (pointer)0x0; pCVar1 = local_108,
          pCVar6 = (pointer)std::vector<Identifier,_std::allocator<Identifier>_>::size
                                      (&(ppVar5->second).parameters), pCVar1 < pCVar6;
          local_108 = (pointer)&local_108->inUnknownBlock) {
        pTVar7 = peekToken(in_RSI,0);
        iVar2 = it;
        if (pTVar7->type == Separator) {
          local_120[0] = std::vector<Identifier,_std::allocator<Identifier>_>::size
                                   (&(ppVar5->second).parameters);
          printError<unsigned_long,unsigned_long>
                    (in_RSI,(Token *)iVar2._M_node,"Too few macro arguments (%d vs %d)",
                     (unsigned_long *)&local_108,local_120);
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                     (nullptr_t)0x0);
          tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
          super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
          goto LAB_001848cf;
        }
        if ((local_108 != (pointer)0x0) && (pTVar7 = nextToken(in_RSI), pTVar7->type != Comma)) {
          printError<>(in_RSI,(Token *)it._M_node,"Macro arguments not comma-separated");
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                     (nullptr_t)0x0);
          tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
          super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
          goto LAB_001848cf;
        }
        extractMacroParameter
                  ((optional<std::vector<Token,_std::allocator<Token>_>_> *)local_148,in_RSI,
                   (Token *)it._M_node);
        bVar3 = std::optional::operator_cast_to_bool((optional *)local_148);
        if (bVar3) {
          pvVar8 = std::optional<std::vector<Token,_std::allocator<Token>_>_>::operator->
                             ((optional<std::vector<Token,_std::allocator<Token>_>_> *)local_148);
          sVar9 = std::vector<Token,_std::allocator<Token>_>::size(pvVar8);
          if (sVar9 == 1) {
            pvVar8 = std::optional<std::vector<Token,_std::allocator<Token>_>_>::operator->
                               ((optional<std::vector<Token,_std::allocator<Token>_>_> *)local_148);
            pvVar10 = std::vector<Token,_std::allocator<Token>_>::front(pvVar8);
            if (pvVar10->type == Identifier) {
              pvVar8 = std::optional<std::vector<Token,_std::allocator<Token>_>_>::operator->
                                 ((optional<std::vector<Token,_std::allocator<Token>_>_> *)local_148
                                 );
              pvVar10 = std::vector<Token,_std::allocator<Token>_>::front(pvVar8);
              pIVar4 = Token::identifierValue(pvVar10);
              pVar12 = std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::
                       insert((set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> *
                              )&i,pIVar4);
              count = (size_t)pVar12.first._M_node;
              local_150 = pVar12.second;
            }
          }
          identifier = std::vector<Identifier,_std::allocator<Identifier>_>::operator[]
                                 (&(ppVar5->second).parameters,(size_type)local_108);
          pvVar8 = std::optional<std::vector<Token,_std::allocator<Token>_>_>::operator*
                             ((optional<std::vector<Token,_std::allocator<Token>_>_> *)local_148);
          Tokenizer::registerReplacement
                    ((Tokenizer *)
                     &identifierParameters._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     identifier,pvVar8);
          tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
          super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 0;
        }
        else {
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                     (nullptr_t)0x0);
          tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
          super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
        }
        std::optional<std::vector<Token,_std::allocator<Token>_>_>::~optional
                  ((optional<std::vector<Token,_std::allocator<Token>_>_> *)local_148);
        if (tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
            super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ != 0)
        goto LAB_001848cf;
      }
      pTVar7 = peekToken(in_RSI,0);
      if (pTVar7->type == Comma) {
        local_160 = std::vector<Identifier,_std::allocator<Identifier>_>::size
                              (&(ppVar5->second).parameters);
        while (pTVar7 = peekToken(in_RSI,0), iVar2 = it, pTVar7->type == Comma) {
          eatToken(in_RSI);
          extractMacroParameter
                    ((optional<std::vector<Token,_std::allocator<Token>_>_> *)
                     &stack0xfffffffffffffe80,in_RSI,(Token *)it._M_node);
          std::optional<std::vector<Token,_std::allocator<Token>_>_>::~optional
                    ((optional<std::vector<Token,_std::allocator<Token>_>_> *)
                     &stack0xfffffffffffffe80);
          local_160 = local_160 + 1;
        }
        local_188 = std::vector<Identifier,_std::allocator<Identifier>_>::size
                              (&(ppVar5->second).parameters);
        printError<unsigned_long,unsigned_long>
                  (in_RSI,(Token *)iVar2._M_node,"Too many macro arguments (%d vs %d)",
                   &stack0xfffffffffffffea0,&stack0xfffffffffffffe78);
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                   (nullptr_t)0x0);
        tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
        _M_payload.
        super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
        super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
      }
      else {
        pTVar7 = nextToken(in_RSI);
        if (pTVar7->type == Separator) {
          bVar3 = isInsideUnknownBlock(in_RSI);
          if ((bVar3) || (bVar3 = isInsideTrueBlock(in_RSI), bVar3)) {
            if ((in_RSI->initializingMacro & 1U) == 0) {
              if ((ppVar5->second).counter == 0) {
                in_RSI->initializingMacro = true;
                TokenStreamTokenizer::init
                          ((TokenStreamTokenizer *)
                           &identifierParameters._M_t._M_impl.super__Rb_tree_header._M_node_count,
                           (EVP_PKEY_CTX *)&(ppVar5->second).content);
                Logger::suppressErrors();
                ghc::filesystem::path::path((path *)&__range1);
                parse((Parser *)local_1a0,(Tokenizer *)in_RSI,
                      (bool)((char)&identifierParameters + '('),(path *)0x1);
                ghc::filesystem::path::~path((path *)&__range1);
                Logger::unsuppressErrors();
                std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::operator=
                          (&(ppVar5->second).labels,&in_RSI->macroLabels);
                std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::clear
                          (&in_RSI->macroLabels);
                in_RSI->initializingMacro = false;
                std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::
                ~unique_ptr((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
                             *)local_1a0);
              }
              this_00 = &(ppVar5->second).labels;
              __end1 = std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::
                       begin(this_00);
              label = (Identifier *)
                      std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::end
                                (this_00);
              while (bVar3 = std::operator!=(&__end1,(_Self *)&label), bVar3) {
                local_1e0 = std::_Rb_tree_const_iterator<Identifier>::operator*(&__end1);
                local_1e8._M_node =
                     (_Base_ptr)
                     std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::find
                               ((set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>
                                 *)&i,local_1e0);
                fullName.field_2._8_8_ =
                     std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::end
                               ((set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>
                                 *)&i);
                bVar3 = std::operator!=(&local_1e8,(_Self *)((long)&fullName.field_2 + 8));
                if (!bVar3) {
                  std::__cxx11::string::string((string *)local_210);
                  Identifier::Identifier(&local_230,local_1e0);
                  bVar3 = SymbolTable::isLocalSymbol(&local_230);
                  Identifier::~Identifier(&local_230);
                  if (bVar3) {
                    psVar11 = Identifier::string_abi_cxx11_(local_1e0);
                    std::__cxx11::string::substr((ulong)&local_270,(ulong)psVar11);
                    tinyformat::format<Identifier,std::__cxx11::string,unsigned_long>
                              (&local_250,(tinyformat *)"@@%s_%s_%08X",(char *)fmt,&local_270,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &(ppVar5->second).counter,in_R9);
                    std::__cxx11::string::operator=((string *)local_210,(string *)&local_250);
                    std::__cxx11::string::~string((string *)&local_250);
                    std::__cxx11::string::~string((string *)&local_270);
                  }
                  else {
                    Identifier::Identifier(&local_290,local_1e0);
                    bVar3 = SymbolTable::isStaticSymbol(&local_290);
                    Identifier::~Identifier(&local_290);
                    if (bVar3) {
                      psVar11 = Identifier::string_abi_cxx11_(local_1e0);
                      std::__cxx11::string::substr((ulong)&local_2d0,(ulong)psVar11);
                      tinyformat::format<Identifier,std::__cxx11::string,unsigned_long>
                                (&local_2b0,(tinyformat *)0x22234e,(char *)fmt,&local_2d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&(ppVar5->second).counter,in_R9);
                      std::__cxx11::string::operator=((string *)local_210,(string *)&local_2b0);
                      std::__cxx11::string::~string((string *)&local_2b0);
                      std::__cxx11::string::~string((string *)&local_2d0);
                    }
                    else {
                      tinyformat::format<Identifier,Identifier,unsigned_long>
                                (&local_2f0,(tinyformat *)0x22234f,(char *)fmt,local_1e0,
                                 (Identifier *)&(ppVar5->second).counter,in_R9);
                      std::__cxx11::string::operator=((string *)local_210,(string *)&local_2f0);
                      std::__cxx11::string::~string((string *)&local_2f0);
                    }
                  }
                  Tokenizer::registerReplacement
                            ((Tokenizer *)
                             &identifierParameters._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             local_1e0,(string *)local_210);
                  std::__cxx11::string::~string((string *)local_210);
                }
                std::_Rb_tree_const_iterator<Identifier>::operator++(&__end1);
              }
              TokenStreamTokenizer::init
                        ((TokenStreamTokenizer *)
                         &identifierParameters._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (EVP_PKEY_CTX *)&(ppVar5->second).content);
              (ppVar5->second).counter = (ppVar5->second).counter + 1;
              ghc::filesystem::path::path(&local_310);
              parse(this,(Tokenizer *)in_RSI,(bool)((char)&identifierParameters + '('),(path *)0x1);
              ghc::filesystem::path::~path(&local_310);
              tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
              .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
            }
            else {
              std::make_unique<DummyCommand>();
              std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
              unique_ptr<DummyCommand,std::default_delete<DummyCommand>,void>
                        ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)
                         this,(unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> *)
                              &command);
              std::unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_>::~unique_ptr
                        ((unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> *)&command);
              tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>
              .super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
            }
          }
          else {
            std::make_unique<DummyCommand>();
            std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
            unique_ptr<DummyCommand,std::default_delete<DummyCommand>,void>
                      ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                       (unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> *)
                       &stack0xfffffffffffffe70);
            std::unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_>::~unique_ptr
                      ((unique_ptr<DummyCommand,_std::default_delete<DummyCommand>_> *)
                       &stack0xfffffffffffffe70);
            tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
            _M_payload.
            super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
            super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
          }
        }
        else {
          printError<>(in_RSI,(Token *)it._M_node,"Macro call not terminated");
          std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
          unique_ptr<std::default_delete<CAssemblerCommand>,void>
                    ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
                     (nullptr_t)0x0);
          tokens.super__Optional_base<std::vector<Token,_std::allocator<Token>_>,_false,_false>.
          _M_payload.
          super__Optional_payload<std::vector<Token,_std::allocator<Token>_>,_true,_false,_false>.
          super__Optional_payload_base<std::vector<Token,_std::allocator<Token>_>_>._28_4_ = 1;
        }
      }
LAB_001848cf:
      std::set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_>::~set
                ((set<Identifier,_std::less<Identifier>,_std::allocator<Identifier>_> *)&i);
      TokenStreamTokenizer::~TokenStreamTokenizer
                ((TokenStreamTokenizer *)
                 &identifierParameters._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> Parser::parseMacroCall()
{
	const Token& start = peekToken();
	if (start.type != TokenType::Identifier)
		return nullptr;

	auto it = macros.find(start.identifierValue());
	if (it == macros.end())
		return nullptr;

	ParserMacro& macro = it->second;
	eatToken();

	// create a token stream for the macro content,
	// registering replacements for parameter values
	TokenStreamTokenizer macroTokenizer;

	std::set<Identifier> identifierParameters;
	for (size_t i = 0; i < macro.parameters.size(); i++)
	{
		if (peekToken().type == TokenType::Separator)
		{
			printError(start, "Too few macro arguments (%d vs %d)",i,macro.parameters.size());
			return nullptr;
		}

		if (i != 0)
		{
			if (nextToken().type != TokenType::Comma)
			{
				printError(start, "Macro arguments not comma-separated");
				return nullptr;
			}
		}

		auto tokens = extractMacroParameter(start);
		if (!tokens)
			return nullptr;

		// remember any single identifier parameters for the label replacement
		if (tokens->size() == 1 && tokens->front().type == TokenType::Identifier)
			identifierParameters.insert(tokens->front().identifierValue());

		// give them as a replacement to new tokenizer
		macroTokenizer.registerReplacement(macro.parameters[i], *tokens);
	}

	if (peekToken().type == TokenType::Comma)
	{
		size_t count = macro.parameters.size();
		while (peekToken().type == TokenType::Comma)
		{
			// skip comma
			eatToken();

			// skip parameter value
			extractMacroParameter(start);
			++count;
		}

		printError(start, "Too many macro arguments (%d vs %d)",count,macro.parameters.size());
		return nullptr;
	}

	if(nextToken().type != TokenType::Separator)
	{
		printError(start, "Macro call not terminated");
		return nullptr;
	}

	// skip macro instantiation in known false blocks
	if (!isInsideUnknownBlock() && !isInsideTrueBlock())
		return std::make_unique<DummyCommand>();

	// a macro is fully parsed once when it's loaded
	// to gather all labels. it's not necessary to
	// instantiate other macros at that time
	if (initializingMacro)
		return std::make_unique<DummyCommand>();

	// the first time a macro is instantiated, it needs to be analyzed
	// for labels
	if (macro.counter == 0)
	{
		initializingMacro = true;
		
		// parse the short lived next command
		macroTokenizer.init(macro.content);
		Logger::suppressErrors();
		std::unique_ptr<CAssemblerCommand> command =  parse(&macroTokenizer,true);
		Logger::unsuppressErrors();

		macro.labels = macroLabels;
		macroLabels.clear();
		
		initializingMacro = false;
	}

	// register labels and replacements
	for (const Identifier& label: macro.labels)
	{
		// check if the label is using the name of a parameter
		// in that case, don't register a unique replacement
		if (identifierParameters.find(label) != identifierParameters.end())
			continue;

		// otherwise make sure the name is unique
		std::string fullName;
		if (Global.symbolTable.isLocalSymbol(Identifier(label)))
			fullName = tfm::format("@@%s_%s_%08X",macro.name,label.string().substr(2),macro.counter);
		else if (Global.symbolTable.isStaticSymbol(Identifier(label)))
			fullName = tfm::format("@%s_%s_%08X",macro.name,label.string().substr(1),macro.counter);
		else
			fullName = tfm::format("%s_%s_%08X",macro.name,label,macro.counter);

		macroTokenizer.registerReplacement(label,fullName);
	}

	macroTokenizer.init(macro.content);
	macro.counter++;

	return parse(&macroTokenizer,true);

}